

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_monster_msg_miss(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  char *local_40;
  wchar_t local_34;
  char *pcStack_30;
  wchar_t s_idx;
  char *msg;
  char *spell;
  monster_race *r;
  parser *p_local;
  
  r = (monster_race *)p;
  spell = (char *)parser_priv(p);
  msg = parser_getsym((parser *)r,"spell");
  _Var1 = parser_hasval((parser *)r,"message");
  if (_Var1) {
    local_40 = parser_getstr((parser *)r,"message");
  }
  else {
    local_40 = (char *)0x0;
  }
  pcStack_30 = local_40;
  if (spell == (char *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    eVar2 = grab_name("monster spell",msg,r_info_spell_flags,0x5d,&local_34);
    if (eVar2 == 0) {
      add_alternate_spell_message((monster_race *)spell,local_34,MON_ALTMSG_MISS,pcStack_30);
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    else {
      p_local._4_4_ = PARSE_ERROR_INVALID_SPELL_NAME;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_monster_msg_miss(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	const char *spell = parser_getsym(p, "spell");
	const char *msg = (parser_hasval(p, "message")) ?
		parser_getstr(p, "message") : NULL;
	int s_idx;

	if (!r) return PARSE_ERROR_MISSING_RECORD_HEADER;
	if (grab_name("monster spell", spell, r_info_spell_flags,
			N_ELEMENTS(r_info_spell_flags) - 1, &s_idx))
			return PARSE_ERROR_INVALID_SPELL_NAME;
	add_alternate_spell_message(r, s_idx, MON_ALTMSG_MISS, msg);

	return PARSE_ERROR_NONE;
}